

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O0

void __thiscall
cmExportFileGenerator::SetImportLinkInterface
          (cmExportFileGenerator *this,string *config,string *suffix,
          PreprocessContext preprocessRule,cmGeneratorTarget *target,ImportPropertyMap *properties)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  cmLinkInterface *pcVar1;
  ImportPropertyMap *pIVar2;
  bool bVar3;
  PolicyStatus PVar4;
  cmLocalGenerator *this_00;
  ostream *poVar5;
  string *psVar6;
  ulong uVar7;
  mapped_type *this_01;
  bool local_329;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  undefined1 local_2b8 [8];
  string prepro;
  string local_278;
  ostringstream local_258 [8];
  ostringstream e;
  cmLocalGenerator *lg;
  undefined1 local_d0 [6];
  bool newCMP0022Behavior;
  cmValue local_b0;
  cmValue prop;
  cmValue local_88;
  cmValue prop_suffixed;
  cmValue propContent;
  allocator<char> local_61;
  string local_60;
  cmLinkInterface *local_40;
  cmLinkInterface *iface;
  ImportPropertyMap *properties_local;
  cmGeneratorTarget *target_local;
  string *psStack_20;
  PreprocessContext preprocessRule_local;
  string *suffix_local;
  string *config_local;
  cmExportFileGenerator *this_local;
  
  iface = (cmLinkInterface *)properties;
  properties_local = (ImportPropertyMap *)target;
  target_local._4_4_ = preprocessRule;
  psStack_20 = suffix;
  suffix_local = config;
  config_local = (string *)this;
  local_40 = cmGeneratorTarget::GetLinkInterface(target,config,target);
  psVar6 = psStack_20;
  pIVar2 = properties_local;
  if (local_40 != (cmLinkInterface *)0x0) {
    if ((local_40->ImplementationIsInterface & 1U) == 0) {
      cmValue::cmValue(&prop_suffixed);
      pIVar2 = properties_local;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&prop,
                     "LINK_INTERFACE_LIBRARIES",psStack_20);
      local_88 = cmGeneratorTarget::GetProperty
                           ((cmGeneratorTarget *)pIVar2,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &prop);
      std::__cxx11::string::~string((string *)&prop);
      bVar3 = cmValue::operator_cast_to_bool(&local_88);
      pIVar2 = properties_local;
      if (bVar3) {
        prop_suffixed.Value = local_88.Value;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_d0,"LINK_INTERFACE_LIBRARIES",(allocator<char> *)((long)&lg + 7))
        ;
        local_b0 = cmGeneratorTarget::GetProperty((cmGeneratorTarget *)pIVar2,(string *)local_d0);
        std::__cxx11::string::~string((string *)local_d0);
        std::allocator<char>::~allocator((allocator<char> *)((long)&lg + 7));
        bVar3 = cmValue::operator_cast_to_bool(&local_b0);
        if (!bVar3) {
          return;
        }
        prop_suffixed.Value = local_b0.Value;
      }
      PVar4 = cmGeneratorTarget::GetPolicyStatusCMP0022((cmGeneratorTarget *)properties_local);
      local_329 = false;
      if (PVar4 != WARN) {
        PVar4 = cmGeneratorTarget::GetPolicyStatusCMP0022((cmGeneratorTarget *)properties_local);
        local_329 = PVar4 != OLD;
      }
      lg._6_1_ = local_329;
      if ((local_329 == false) || ((this->ExportOld & 1U) != 0)) {
        cmValue::operator->[abi_cxx11_(&prop_suffixed);
        uVar7 = std::__cxx11::string::empty();
        pcVar1 = iface;
        if ((uVar7 & 1) == 0) {
          psVar6 = cmValue::operator*[abi_cxx11_(&prop_suffixed);
          cmGeneratorExpression::Preprocess((string *)local_2b8,psVar6,target_local._4_4_,false);
          uVar7 = std::__cxx11::string::empty();
          if ((uVar7 & 1) == 0) {
            ResolveTargetsInGeneratorExpressions
                      (this,(string *)local_2b8,(cmGeneratorTarget *)properties_local,
                       ReplaceFreeTargets);
            pcVar1 = iface;
            std::operator+(&local_2d8,"IMPORTED_LINK_INTERFACE_LIBRARIES",psStack_20);
            this_01 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)pcVar1,&local_2d8);
            std::__cxx11::string::operator=((string *)this_01,(string *)local_2b8);
            std::__cxx11::string::~string((string *)&local_2d8);
          }
          std::__cxx11::string::~string((string *)local_2b8);
        }
        else {
          __return_storage_ptr__ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&prepro.field_2 + 8);
          std::operator+(__return_storage_ptr__,"IMPORTED_LINK_INTERFACE_LIBRARIES",psStack_20);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)pcVar1,__return_storage_ptr__);
          std::__cxx11::string::clear();
          std::__cxx11::string::~string((string *)(prepro.field_2._M_local_buf + 8));
        }
      }
      else {
        this_00 = cmGeneratorTarget::GetLocalGenerator((cmGeneratorTarget *)properties_local);
        std::__cxx11::ostringstream::ostringstream(local_258);
        poVar5 = std::operator<<((ostream *)local_258,"Target \"");
        psVar6 = cmGeneratorTarget::GetName_abi_cxx11_((cmGeneratorTarget *)properties_local);
        poVar5 = std::operator<<(poVar5,(string *)psVar6);
        std::operator<<(poVar5,
                        "\" has policy CMP0022 enabled, but also has old-style LINK_INTERFACE_LIBRARIES properties populated, but it was exported without the EXPORT_LINK_INTERFACE_LIBRARIES to export the old-style properties"
                       );
        std::__cxx11::ostringstream::str();
        cmLocalGenerator::IssueMessage(this_00,FATAL_ERROR,&local_278);
        std::__cxx11::string::~string((string *)&local_278);
        std::__cxx11::ostringstream::~ostringstream(local_258);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_60,"IMPORTED_LINK_INTERFACE_LIBRARIES",&local_61);
      SetImportLinkProperty<cmLinkItem>
                (this,psVar6,(cmGeneratorTarget *)pIVar2,&local_60,
                 (vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)local_40,
                 (ImportPropertyMap *)iface,Yes);
      std::__cxx11::string::~string((string *)&local_60);
      std::allocator<char>::~allocator(&local_61);
    }
  }
  return;
}

Assistant:

void cmExportFileGenerator::SetImportLinkInterface(
  const std::string& config, std::string const& suffix,
  cmGeneratorExpression::PreprocessContext preprocessRule,
  cmGeneratorTarget const* target, ImportPropertyMap& properties)
{
  // Add the transitive link dependencies for this configuration.
  cmLinkInterface const* iface = target->GetLinkInterface(config, target);
  if (!iface) {
    return;
  }

  if (iface->ImplementationIsInterface) {
    // Policy CMP0022 must not be NEW.
    this->SetImportLinkProperty(
      suffix, target, "IMPORTED_LINK_INTERFACE_LIBRARIES", iface->Libraries,
      properties, ImportLinkPropertyTargetNames::Yes);
    return;
  }

  cmValue propContent;

  if (cmValue prop_suffixed =
        target->GetProperty("LINK_INTERFACE_LIBRARIES" + suffix)) {
    propContent = prop_suffixed;
  } else if (cmValue prop = target->GetProperty("LINK_INTERFACE_LIBRARIES")) {
    propContent = prop;
  } else {
    return;
  }

  const bool newCMP0022Behavior =
    target->GetPolicyStatusCMP0022() != cmPolicies::WARN &&
    target->GetPolicyStatusCMP0022() != cmPolicies::OLD;

  if (newCMP0022Behavior && !this->ExportOld) {
    cmLocalGenerator* lg = target->GetLocalGenerator();
    std::ostringstream e;
    e << "Target \"" << target->GetName()
      << "\" has policy CMP0022 enabled, "
         "but also has old-style LINK_INTERFACE_LIBRARIES properties "
         "populated, but it was exported without the "
         "EXPORT_LINK_INTERFACE_LIBRARIES to export the old-style properties";
    lg->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }

  if (propContent->empty()) {
    properties["IMPORTED_LINK_INTERFACE_LIBRARIES" + suffix].clear();
    return;
  }

  std::string prepro =
    cmGeneratorExpression::Preprocess(*propContent, preprocessRule);
  if (!prepro.empty()) {
    this->ResolveTargetsInGeneratorExpressions(prepro, target,
                                               ReplaceFreeTargets);
    properties["IMPORTED_LINK_INTERFACE_LIBRARIES" + suffix] = prepro;
  }
}